

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O1

bool senjo::ParamValue(string *value,char **params,string *next)

{
  size_type sVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  pcVar7 = *params;
  if (pcVar7 == (char *)0x0) {
    return false;
  }
  cVar3 = *pcVar7;
  if (cVar3 != '\0') {
    pcVar7 = pcVar7 + 1;
    do {
      iVar4 = isspace((int)cVar3);
      if (iVar4 == 0) break;
      *params = pcVar7;
      cVar3 = *pcVar7;
      pcVar7 = pcVar7 + 1;
    } while (cVar3 != '\0');
    pcVar7 = pcVar7 + -1;
  }
  if (*pcVar7 == '\0') {
    return false;
  }
  sVar1 = next->_M_string_length;
  if (sVar1 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = strstr(*params,(next->_M_dataplus)._M_p);
  }
  bVar8 = pcVar7 == (char *)0x0;
  if (!bVar8) {
    cVar3 = pcVar7[sVar1];
    if (cVar3 != '\0') {
      pcVar2 = (next->_M_dataplus)._M_p;
      do {
        pcVar6 = pcVar7 + sVar1;
        iVar4 = isspace((int)cVar3);
        if (iVar4 != 0) break;
        cVar3 = *pcVar6;
        while ((cVar3 != '\0' && (iVar4 = isspace((int)cVar3), iVar4 == 0))) {
          cVar3 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        pcVar7 = strstr(pcVar6,pcVar2);
        bVar8 = pcVar7 == (char *)0x0;
        if (bVar8) goto LAB_00140b8f;
        cVar3 = pcVar7[sVar1];
      } while (cVar3 != '\0');
    }
    if (!bVar8) goto LAB_00140ba0;
  }
LAB_00140b8f:
  pcVar7 = *params;
  sVar5 = strlen(pcVar7);
  pcVar7 = pcVar7 + sVar5;
LAB_00140ba0:
  pcVar2 = *params;
  do {
    if (pcVar7 <= pcVar2) break;
    pcVar6 = pcVar7 + -1;
    pcVar7 = pcVar7 + -1;
    iVar4 = isspace((int)*pcVar6);
  } while (iVar4 != 0);
  std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,(ulong)pcVar2);
  sVar1 = value->_M_string_length;
  if (sVar1 != 0) {
    pcVar7 = *params;
    *params = pcVar7 + sVar1;
    cVar3 = pcVar7[sVar1];
    if (cVar3 != '\0') {
      pcVar7 = pcVar7 + sVar1;
      do {
        pcVar7 = pcVar7 + 1;
        iVar4 = isspace((int)cVar3);
        if (iVar4 == 0) break;
        *params = pcVar7;
        cVar3 = *pcVar7;
      } while (cVar3 != '\0');
    }
    if (sVar1 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool ParamValue(std::string& value, const char*& params,
                              const std::string& next)
{
  if (params && *NextWord(params)) {
    const char* end = next.size() ? strstr(params, next.c_str()) : NULL;
    while (end && end[next.size()] && !isspace(end[next.size()])) {
      NextSpace(end += next.size());
      end = strstr(end, next.c_str());
    }
    if (!end) {
      end = (params + strlen(params));
    }
    while ((end > params) && isspace(end[-1])) {
      --end;
    }
    value.assign(params, (end - params));
    if (value.size()) {
      NextWord(params += value.size());
      return true;
    }
  }
  return false;
}